

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

shared_ptr<const_void> __thiscall pstore::storage::address_to_pointer(storage *this,address addr)

{
  address in_RDX;
  shared_ptr<const_void> sVar1;
  storage *this_local;
  address addr_local;
  
  sVar1 = address_to_pointer_impl<pstore::storage_const,std::shared_ptr<void_const>>
                    (this,(storage *)addr.a_,in_RDX);
  sVar1.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<const_void>)sVar1.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<void const> address_to_pointer (address const addr) const noexcept {
            return address_to_pointer_impl (*this, addr);
        }